

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clmul_4bytes.cpp
# Opt level: O2

Sketch * ConstructClMul4Bytes(int bits,int implementation)

{
  long lVar1;
  Elem EVar2;
  Sketch *pSVar3;
  GenField<unsigned_int,_32,_141U,_&(anonymous_namespace)::MulWithClMulReduce,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::SQR2_TABLE_32,_&(anonymous_namespace)::SQR4_TABLE_32,_&(anonymous_namespace)::SQR8_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_IdTrans,_&ID_TRANS,_&ID_TRANS>
  *this;
  random_device *__urng;
  long in_FS_OFFSET;
  uniform_int_distribution<unsigned_long> local_13b8;
  random_device rng;
  
  rng.field_0._912_8_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (bits == 0x20) {
    pSVar3 = (Sketch *)operator_new(0x40);
    pSVar3->m_implementation = implementation;
    pSVar3->m_bits = 0x20;
    pSVar3->_vptr_Sketch = (_func_int **)0x1145860;
    pSVar3[1].m_canary = 0;
    pSVar3[1].m_implementation = 0;
    pSVar3[1].m_bits = 0;
    pSVar3[2]._vptr_Sketch = (_func_int **)0x0;
    std::random_device::random_device(&rng);
    local_13b8._M_param._M_a = 0;
    local_13b8._M_param._M_b = 0xffffffffffffffff;
    __urng = &rng;
    this = (GenField<unsigned_int,_32,_141U,_&(anonymous_namespace)::MulWithClMulReduce,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::SQR2_TABLE_32,_&(anonymous_namespace)::SQR4_TABLE_32,_&(anonymous_namespace)::SQR8_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_IdTrans,_&ID_TRANS,_&ID_TRANS>
            *)std::uniform_int_distribution<unsigned_long>::operator()(&local_13b8,__urng);
    EVar2 = anon_unknown.dwarf_2ecfa1c::
            GenField<unsigned_int,_32,_141U,_&(anonymous_namespace)::MulWithClMulReduce,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::SQR2_TABLE_32,_&(anonymous_namespace)::SQR4_TABLE_32,_&(anonymous_namespace)::SQR8_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32,_IdTrans,_&ID_TRANS,_&ID_TRANS>
            ::FromSeed(this,(uint64_t)__urng);
    *(Elem *)&pSVar3[2].m_canary = EVar2;
    std::random_device::~random_device(&rng);
  }
  else {
    pSVar3 = (Sketch *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pSVar3;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructClMul4Bytes(int bits, int implementation) {
    switch (bits) {
#ifdef ENABLE_FIELD_INT_25
    case 25: return new SketchImpl<Field25>(implementation, 25);
#endif
#ifdef ENABLE_FIELD_INT_26
    case 26: return new SketchImpl<Field26>(implementation, 26);
#endif
#ifdef ENABLE_FIELD_INT_27
    case 27: return new SketchImpl<Field27>(implementation, 27);
#endif
#ifdef ENABLE_FIELD_INT_29
    case 29: return new SketchImpl<Field29>(implementation, 29);
#endif
#ifdef ENABLE_FIELD_INT_31
    case 31: return new SketchImpl<Field31>(implementation, 31);
#endif
#ifdef ENABLE_FIELD_INT_32
    case 32: return new SketchImpl<Field32>(implementation, 32);
#endif
    }
    return nullptr;
}